

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

char * testing::internal::String::CloneCString(char *c_str)

{
  size_t __n;
  char *__dest;
  
  if (c_str == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    __n = strlen(c_str);
    __dest = (char *)operator_new__(__n + 1);
    strncpy(__dest,c_str,__n);
    __dest[__n] = '\0';
  }
  return __dest;
}

Assistant:

const char * String::CloneCString(const char* c_str) {
  return (c_str == NULL) ?
                    NULL : CloneString(c_str, strlen(c_str));
}